

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3EndTable(Parse *pParse,Token *pCons,Token *pEnd,u8 tabOpts,Select *pSelect)

{
  byte *pbVar1;
  byte bVar2;
  u16 uVar3;
  short sVar4;
  int iVar5;
  Table *pTab;
  sqlite3 *db;
  Column *pCVar6;
  Index *pIdx;
  LogEst LVar7;
  uint uVar8;
  int p2;
  void *pvVar9;
  Vdbe *pVVar10;
  Parse *pPVar11;
  Token *pTVar12;
  Table *pTable;
  size_t sVar13;
  Expr *pExpr;
  ExprList *pList;
  ushort uVar14;
  int iVar15;
  Op *pOVar16;
  short sVar17;
  Schema **ppSVar18;
  u8 *puVar19;
  char *pcVar20;
  long lVar21;
  uint uVar22;
  char *pcVar23;
  ulong uVar24;
  short *psVar25;
  short *psVar26;
  int iVar27;
  ulong uVar28;
  Index *pIVar29;
  int iVar30;
  bool bVar31;
  SelectDest dest;
  
  if (pEnd == (Token *)0x0 && pSelect == (Select *)0x0) {
    return;
  }
  pTab = pParse->pNewTable;
  if (pTab == (Table *)0x0) {
    return;
  }
  db = pParse->db;
  if (((db->init).busy != '\0') && (iVar15 = (db->init).newTnum, pTab->tnum = iVar15, iVar15 == 1))
  {
    *(byte *)&pTab->tabFlags = (byte)pTab->tabFlags | 1;
  }
  if ((tabOpts & 0x20) != 0) {
    uVar8 = pTab->tabFlags;
    if ((uVar8 & 8) != 0) {
      sqlite3ErrorMsg(pParse,"AUTOINCREMENT not allowed on WITHOUT ROWID tables");
      return;
    }
    if ((uVar8 & 4) == 0) {
      sqlite3ErrorMsg(pParse,"PRIMARY KEY missing on table %s",pTab->zName);
    }
    else {
      pTab->tabFlags = uVar8 | 0x60;
      pVVar10 = pParse->pVdbe;
      if (((db->init).imposterTable == '\0') && (sVar17 = pTab->nCol, 0 < (long)sVar17)) {
        pCVar6 = pTab->aCol;
        lVar21 = 0;
        do {
          if (((&pCVar6->colFlags)[lVar21] & 1) != 0) {
            (&pCVar6->notNull)[lVar21] = '\x02';
          }
          lVar21 = lVar21 + 0x20;
        } while ((long)sVar17 * 0x20 != lVar21);
      }
      if (pParse->declareVtab == '\0') {
        iVar15 = pParse->addrCrTab;
        if (iVar15 != 0) {
          if (iVar15 < 0) {
            iVar15 = pVVar10->nOp + -1;
          }
          if (pVVar10->db->mallocFailed == '\0') {
            pOVar16 = pVVar10->aOp + iVar15;
          }
          else {
            pOVar16 = (Op *)&sqlite3VdbeGetOp_dummy;
          }
          pOVar16->opcode = 0x86;
        }
        if ((long)pTab->iPKey < 0) {
          for (pIVar29 = pTab->pIndex; pIVar29 != (Index *)0x0; pIVar29 = pIVar29->pNext) {
            if ((pIVar29->field_0x63 & 3) == 2) goto LAB_00221472;
          }
          pIVar29 = (Index *)0x0;
LAB_00221472:
          uVar14 = pIVar29->nKeyCol;
          iVar15 = 1;
          if (1 < uVar14) {
            psVar25 = pIVar29->aiColumn;
            iVar15 = 1;
            uVar28 = 1;
            do {
              psVar26 = psVar25;
              iVar27 = iVar15;
              do {
                if (iVar27 < 1) {
                  lVar21 = (long)iVar15;
                  iVar15 = iVar15 + 1;
                  psVar25[lVar21] = psVar25[uVar28];
                  uVar14 = pIVar29->nKeyCol;
                  goto LAB_002214c3;
                }
                iVar27 = iVar27 + -1;
                sVar17 = *psVar26;
                psVar26 = psVar26 + 1;
              } while (sVar17 != psVar25[uVar28]);
              pIVar29->nColumn = pIVar29->nColumn - 1;
LAB_002214c3:
              uVar28 = uVar28 + 1;
            } while (uVar28 < uVar14);
          }
          pIVar29->nKeyCol = (u16)iVar15;
        }
        else {
          dest._0_8_ = pTab->aCol[pTab->iPKey].zName;
          if ((char *)dest._0_8_ == (char *)0x0) {
            uVar8 = 0;
          }
          else {
            sVar13 = strlen((char *)dest._0_8_);
            uVar8 = (uint)sVar13 & 0x3fffffff;
          }
          dest.iSdst = uVar8;
          pExpr = sqlite3ExprAlloc(db,0x1b,(Token *)&dest,0);
          pList = sqlite3ExprListAppend((Parse *)pParse->db,(ExprList *)0x0,pExpr);
          if (pList == (ExprList *)0x0) goto LAB_00220dfe;
          pList->a[0].sortOrder = pParse->iPkSortOrder;
          sqlite3CreateIndex(pParse,(Token *)0x0,(Token *)0x0,(SrcList *)0x0,pList,
                             (uint)pTab->keyConf,(Token *)0x0,(Expr *)0x0,0,0,'\x02');
          if (db->mallocFailed != '\0') goto LAB_00220dfe;
          for (pIVar29 = pTab->pIndex; pIVar29 != (Index *)0x0; pIVar29 = pIVar29->pNext) {
            if ((pIVar29->field_0x63 & 3) == 2) goto LAB_00221571;
          }
          pIVar29 = (Index *)0x0;
LAB_00221571:
          pTab->iPKey = -1;
        }
        bVar2 = pIVar29->field_0x63;
        pIVar29->field_0x63 = bVar2 | 0x20;
        if ((db->init).imposterTable == '\0') {
          pIVar29->field_0x63 = bVar2 | 0x28;
        }
        uVar14 = pIVar29->nKeyCol;
        uVar28 = (ulong)uVar14;
        if ((pVVar10 != (Vdbe *)0x0) && (0 < (long)pIVar29->tnum)) {
          if (pVVar10->db->mallocFailed == '\0') {
            pOVar16 = pVVar10->aOp + pIVar29->tnum;
          }
          else {
            pOVar16 = (Op *)&sqlite3VdbeGetOp_dummy;
          }
          pOVar16->opcode = '\r';
        }
        pIVar29->tnum = pTab->tnum;
        for (pIdx = pTab->pIndex; pIdx != (Index *)0x0; pIdx = pIdx->pNext) {
          if ((pIdx->field_0x63 & 3) != 2) {
            if (uVar28 != 0) {
              uVar24 = 0;
              iVar15 = 0;
              do {
                uVar8 = (uint)pIdx->nKeyCol;
                psVar25 = pIdx->aiColumn;
                do {
                  if ((int)uVar8 < 1) {
                    iVar15 = iVar15 + 1;
                    break;
                  }
                  uVar8 = uVar8 - 1;
                  sVar17 = *psVar25;
                  psVar25 = psVar25 + 1;
                } while (sVar17 != pIVar29->aiColumn[uVar24]);
                uVar24 = uVar24 + 1;
              } while (uVar24 != uVar28);
              if (iVar15 != 0) {
                iVar15 = resizeIndexObject(db,pIdx,iVar15 + (uint)pIdx->nKeyCol);
                if (iVar15 == 0) {
                  if (uVar28 != 0) {
                    uVar8 = (uint)pIdx->nKeyCol;
                    uVar24 = 0;
                    do {
                      uVar22 = (uint)pIdx->nKeyCol;
                      psVar25 = pIdx->aiColumn;
                      do {
                        if ((int)uVar22 < 1) {
                          pIdx->aiColumn[(int)uVar8] = pIVar29->aiColumn[uVar24];
                          pIdx->azColl[(int)uVar8] = pIVar29->azColl[uVar24];
                          uVar8 = uVar8 + 1;
                          break;
                        }
                        uVar22 = uVar22 - 1;
                        sVar17 = *psVar25;
                        psVar25 = psVar25 + 1;
                      } while (sVar17 != pIVar29->aiColumn[uVar24]);
                      uVar24 = uVar24 + 1;
                    } while (uVar24 != uVar28);
                  }
                  goto LAB_002216be;
                }
                goto LAB_00220dfe;
              }
            }
            pIdx->nColumn = pIdx->nKeyCol;
          }
LAB_002216be:
        }
        uVar3 = pTab->nCol;
        if ((int)(uint)uVar14 < (int)(short)uVar3) {
          iVar15 = resizeIndexObject(db,pIVar29,(int)(short)uVar3);
          if ((iVar15 == 0) && (sVar17 = pTab->nCol, 0 < sVar17)) {
            iVar15 = 0;
            do {
              iVar27 = (int)uVar28;
              psVar25 = pIVar29->aiColumn;
              uVar24 = uVar28;
              do {
                if ((int)uVar24 < 1) {
                  pIVar29->aiColumn[iVar27] = (short)iVar15;
                  pIVar29->azColl[iVar27] = "BINARY";
                  uVar28 = (ulong)(iVar27 + 1);
                  sVar17 = pTab->nCol;
                  break;
                }
                uVar24 = (ulong)((int)uVar24 - 1);
                sVar4 = *psVar25;
                psVar25 = psVar25 + 1;
              } while (iVar15 != sVar4);
              iVar15 = iVar15 + 1;
            } while (iVar15 < sVar17);
          }
        }
        else {
          pIVar29->nColumn = uVar3;
        }
      }
    }
  }
LAB_00220dfe:
  if (pTab->pSchema == (Schema *)0x0) {
    uVar28 = 0xfff0bdc0;
  }
  else {
    uVar8 = db->nDb;
    if ((int)uVar8 < 1) {
      uVar28 = 0;
    }
    else {
      ppSVar18 = &db->aDb->pSchema;
      uVar28 = 0;
      do {
        if (*ppSVar18 == pTab->pSchema) goto LAB_00220e86;
        uVar28 = uVar28 + 1;
        ppSVar18 = ppSVar18 + 4;
      } while (uVar8 != uVar28);
      uVar28 = (ulong)uVar8;
    }
  }
LAB_00220e86:
  if (pTab->pCheck != (ExprList *)0x0) {
    sqlite3ResolveSelfReference(pParse,pTab,4,(Expr *)0x0,pTab->pCheck);
  }
  if (pTab->nCol < 1) {
    iVar15 = 0;
  }
  else {
    uVar8 = (int)pTab->nCol + 1;
    puVar19 = &pTab->aCol->szEst;
    iVar15 = 0;
    do {
      iVar15 = iVar15 + (uint)*puVar19;
      uVar8 = uVar8 - 1;
      puVar19 = puVar19 + 0x20;
    } while (1 < uVar8);
  }
  LVar7 = sqlite3LogEst((ulong)(((uint)((ushort)pTab->iPKey >> 0xf) + iVar15) * 4));
  pTab->szTabRow = LVar7;
  for (pIVar29 = pTab->pIndex; pIVar29 != (Index *)0x0; pIVar29 = pIVar29->pNext) {
    estimateIndexWidth(pIVar29);
  }
  if ((db->init).busy == '\0') {
    pVVar10 = pParse->pVdbe;
    if ((pVVar10 == (Vdbe *)0x0) && (pVVar10 = allocVdbe(pParse), pVVar10 == (Vdbe *)0x0)) {
      return;
    }
    sqlite3VdbeAddOp3(pVVar10,0x70,0,0,0);
    bVar31 = pTab->pSelect == (Select *)0x0;
    pcVar20 = "VIEW";
    if (bVar31) {
      pcVar20 = "TABLE";
    }
    pcVar23 = "view";
    if (bVar31) {
      pcVar23 = "table";
    }
    iVar15 = (int)uVar28;
    if (pSelect == (Select *)0x0) {
      pTVar12 = &pParse->sLastToken;
      if (tabOpts == '\0') {
        pTVar12 = pEnd;
      }
      uVar8 = (int)pTVar12->z - (int)(pParse->sNameToken).z;
      if (*pTVar12->z != ';') {
        uVar8 = uVar8 + pTVar12->n;
      }
      pcVar20 = sqlite3MPrintf(db,"CREATE %s %.*s",pcVar20,(ulong)uVar8);
    }
    else {
      iVar27 = pParse->nMem;
      iVar30 = iVar27 + 1;
      p2 = iVar27 + 3;
      pParse->nMem = p2;
      pPVar11 = pParse->pToplevel;
      if (pParse->pToplevel == (Parse *)0x0) {
        pPVar11 = pParse;
      }
      pPVar11->mayAbort = '\x01';
      sqlite3VdbeAddOp3(pVVar10,0x69,1,pParse->regRoot,iVar15);
      iVar5 = pVVar10->nOp;
      if (0 < (long)iVar5) {
        pVVar10->aOp[(long)iVar5 + -1].p5 = 0x10;
      }
      pParse->nTab = 2;
      sqlite3VdbeAddOp3(pVVar10,0xf,iVar30,0,iVar5 + 1);
      dest.eDest = '\r';
      dest.iSDParm = iVar30;
      dest.iSdst = 0;
      dest.nSdst = 0;
      dest.zAffSdst = (char *)0x0;
      sqlite3Select(pParse,pSelect,&dest);
      sqlite3VdbeAddOp3(pVVar10,0x35,iVar30,0,0);
      pPVar11 = pVVar10->pParse;
      pPVar11->nTempReg = '\0';
      pPVar11->nRangeReg = 0;
      if (pVVar10->db->mallocFailed == '\0') {
        iVar30 = pVVar10->nOp + -1;
        if (-1 < iVar5) {
          iVar30 = iVar5;
        }
        pOVar16 = pVVar10->aOp + iVar30;
      }
      else {
        pOVar16 = (Op *)&sqlite3VdbeGetOp_dummy;
      }
      pOVar16->p2 = pVVar10->nOp;
      if (pParse->nErr != 0) {
        return;
      }
      pTable = sqlite3ResultSetOfSelect(pParse,pSelect);
      if (pTable == (Table *)0x0) {
        return;
      }
      pTab->nCol = pTable->nCol;
      pTab->aCol = pTable->aCol;
      pTable->nCol = 0;
      pTable->aCol = (Column *)0x0;
      sqlite3DeleteTable(db,pTable);
      iVar30 = sqlite3VdbeAddOp3(pVVar10,0x10,dest.iSDParm,0,0);
      sqlite3VdbeAddOp3(pVVar10,99,dest.iSdst,dest.nSdst,iVar27 + 2);
      sqlite3TableAffinity(pVVar10,pTab,0);
      sqlite3VdbeAddOp3(pVVar10,0x73,1,p2,0);
      sqlite3VdbeAddOp3(pVVar10,0x74,1,iVar27 + 2,p2);
      sqlite3VdbeAddOp3(pVVar10,0xd,0,iVar30,0);
      if (pVVar10->db->mallocFailed == '\0') {
        iVar27 = pVVar10->nOp + -1;
        if (-1 < iVar30) {
          iVar27 = iVar30;
        }
        pOVar16 = pVVar10->aOp + iVar27;
      }
      else {
        pOVar16 = (Op *)&sqlite3VdbeGetOp_dummy;
      }
      pOVar16->p2 = pVVar10->nOp;
      sqlite3VdbeAddOp3(pVVar10,0x70,1,0,0);
      pcVar20 = createTableStmt(db,pTab);
    }
    sqlite3NestedParse(pParse,
                       "UPDATE %Q.%s SET type=\'%s\', name=%Q, tbl_name=%Q, rootpage=#%d, sql=%Q WHERE rowid=#%d"
                       ,db->aDb[iVar15].zDbSName,"sqlite_master",pcVar23,pTab->zName,pTab->zName,
                       (ulong)(uint)pParse->regRoot,pcVar20,(ulong)(uint)pParse->regRowid);
    if (pcVar20 != (char *)0x0) {
      sqlite3DbFreeNN(db,pcVar20);
    }
    sqlite3VdbeAddOp3(pParse->pVdbe,0x66,iVar15,1,
                      (pParse->db->aDb[iVar15].pSchema)->schema_cookie + 1);
    if (((pTab->tabFlags & 8) != 0) && ((db->aDb[iVar15].pSchema)->pSeqTab == (Table *)0x0)) {
      sqlite3NestedParse(pParse,"CREATE TABLE %Q.sqlite_sequence(name,seq)",db->aDb[iVar15].zDbSName
                        );
    }
    pcVar20 = sqlite3MPrintf(db,"tbl_name=\'%q\' AND type!=\'trigger\'",pTab->zName);
    sqlite3VdbeAddParseSchemaOp(pVVar10,iVar15,pcVar20);
    if ((db->init).busy == '\0') {
      return;
    }
  }
  pvVar9 = sqlite3HashInsert(&pTab->pSchema->tblHash,pTab->zName,pTab);
  if (pvVar9 == (void *)0x0) {
    pParse->pNewTable = (Table *)0x0;
    pbVar1 = (byte *)((long)&db->flags + 2);
    *pbVar1 = *pbVar1 | 0x80;
    if (pTab->pSelect == (Select *)0x0) {
      pcVar20 = (pParse->sNameToken).z;
      if (pCons->z != (char *)0x0) {
        pEnd = pCons;
      }
      iVar15 = sqlite3Utf8CharLen(pcVar20,*(int *)&pEnd->z - (int)pcVar20);
      pTab->addColOffset = iVar15 + 0xd;
    }
  }
  else if ((db->mallocFailed == '\0') && (db->bBenignMalloc == '\0')) {
    db->mallocFailed = '\x01';
    if (0 < db->nVdbeExec) {
      (db->u1).isInterrupted = 1;
    }
    (db->lookaside).bDisable = (db->lookaside).bDisable + 1;
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3EndTable(
  Parse *pParse,          /* Parse context */
  Token *pCons,           /* The ',' token after the last column defn. */
  Token *pEnd,            /* The ')' before options in the CREATE TABLE */
  u8 tabOpts,             /* Extra table options. Usually 0. */
  Select *pSelect         /* Select from a "CREATE ... AS SELECT" */
){
  Table *p;                 /* The new table */
  sqlite3 *db = pParse->db; /* The database connection */
  int iDb;                  /* Database in which the table lives */
  Index *pIdx;              /* An implied index of the table */

  if( pEnd==0 && pSelect==0 ){
    return;
  }
  assert( !db->mallocFailed );
  p = pParse->pNewTable;
  if( p==0 ) return;

  assert( !db->init.busy || !pSelect );

  /* If the db->init.busy is 1 it means we are reading the SQL off the
  ** "sqlite_master" or "sqlite_temp_master" table on the disk.
  ** So do not write to the disk again.  Extract the root page number
  ** for the table from the db->init.newTnum field.  (The page number
  ** should have been put there by the sqliteOpenCb routine.)
  **
  ** If the root page number is 1, that means this is the sqlite_master
  ** table itself.  So mark it read-only.
  */
  if( db->init.busy ){
    p->tnum = db->init.newTnum;
    if( p->tnum==1 ) p->tabFlags |= TF_Readonly;
  }

  /* Special processing for WITHOUT ROWID Tables */
  if( tabOpts & TF_WithoutRowid ){
    if( (p->tabFlags & TF_Autoincrement) ){
      sqlite3ErrorMsg(pParse,
          "AUTOINCREMENT not allowed on WITHOUT ROWID tables");
      return;
    }
    if( (p->tabFlags & TF_HasPrimaryKey)==0 ){
      sqlite3ErrorMsg(pParse, "PRIMARY KEY missing on table %s", p->zName);
    }else{
      p->tabFlags |= TF_WithoutRowid | TF_NoVisibleRowid;
      convertToWithoutRowidTable(pParse, p);
    }
  }

  iDb = sqlite3SchemaToIndex(db, p->pSchema);

#ifndef SQLITE_OMIT_CHECK
  /* Resolve names in all CHECK constraint expressions.
  */
  if( p->pCheck ){
    sqlite3ResolveSelfReference(pParse, p, NC_IsCheck, 0, p->pCheck);
  }
#endif /* !defined(SQLITE_OMIT_CHECK) */

  /* Estimate the average row size for the table and for all implied indices */
  estimateTableWidth(p);
  for(pIdx=p->pIndex; pIdx; pIdx=pIdx->pNext){
    estimateIndexWidth(pIdx);
  }

  /* If not initializing, then create a record for the new table
  ** in the SQLITE_MASTER table of the database.
  **
  ** If this is a TEMPORARY table, write the entry into the auxiliary
  ** file instead of into the main database file.
  */
  if( !db->init.busy ){
    int n;
    Vdbe *v;
    char *zType;    /* "view" or "table" */
    char *zType2;   /* "VIEW" or "TABLE" */
    char *zStmt;    /* Text of the CREATE TABLE or CREATE VIEW statement */

    v = sqlite3GetVdbe(pParse);
    if( NEVER(v==0) ) return;

    sqlite3VdbeAddOp1(v, OP_Close, 0);

    /* 
    ** Initialize zType for the new view or table.
    */
    if( p->pSelect==0 ){
      /* A regular table */
      zType = "table";
      zType2 = "TABLE";
#ifndef SQLITE_OMIT_VIEW
    }else{
      /* A view */
      zType = "view";
      zType2 = "VIEW";
#endif
    }

    /* If this is a CREATE TABLE xx AS SELECT ..., execute the SELECT
    ** statement to populate the new table. The root-page number for the
    ** new table is in register pParse->regRoot.
    **
    ** Once the SELECT has been coded by sqlite3Select(), it is in a
    ** suitable state to query for the column names and types to be used
    ** by the new table.
    **
    ** A shared-cache write-lock is not required to write to the new table,
    ** as a schema-lock must have already been obtained to create it. Since
    ** a schema-lock excludes all other database users, the write-lock would
    ** be redundant.
    */
    if( pSelect ){
      SelectDest dest;    /* Where the SELECT should store results */
      int regYield;       /* Register holding co-routine entry-point */
      int addrTop;        /* Top of the co-routine */
      int regRec;         /* A record to be insert into the new table */
      int regRowid;       /* Rowid of the next row to insert */
      int addrInsLoop;    /* Top of the loop for inserting rows */
      Table *pSelTab;     /* A table that describes the SELECT results */

      regYield = ++pParse->nMem;
      regRec = ++pParse->nMem;
      regRowid = ++pParse->nMem;
      assert(pParse->nTab==1);
      sqlite3MayAbort(pParse);
      sqlite3VdbeAddOp3(v, OP_OpenWrite, 1, pParse->regRoot, iDb);
      sqlite3VdbeChangeP5(v, OPFLAG_P2ISREG);
      pParse->nTab = 2;
      addrTop = sqlite3VdbeCurrentAddr(v) + 1;
      sqlite3VdbeAddOp3(v, OP_InitCoroutine, regYield, 0, addrTop);
      sqlite3SelectDestInit(&dest, SRT_Coroutine, regYield);
      sqlite3Select(pParse, pSelect, &dest);
      sqlite3VdbeEndCoroutine(v, regYield);
      sqlite3VdbeJumpHere(v, addrTop - 1);
      if( pParse->nErr ) return;
      pSelTab = sqlite3ResultSetOfSelect(pParse, pSelect);
      if( pSelTab==0 ) return;
      assert( p->aCol==0 );
      p->nCol = pSelTab->nCol;
      p->aCol = pSelTab->aCol;
      pSelTab->nCol = 0;
      pSelTab->aCol = 0;
      sqlite3DeleteTable(db, pSelTab);
      addrInsLoop = sqlite3VdbeAddOp1(v, OP_Yield, dest.iSDParm);
      VdbeCoverage(v);
      sqlite3VdbeAddOp3(v, OP_MakeRecord, dest.iSdst, dest.nSdst, regRec);
      sqlite3TableAffinity(v, p, 0);
      sqlite3VdbeAddOp2(v, OP_NewRowid, 1, regRowid);
      sqlite3VdbeAddOp3(v, OP_Insert, 1, regRec, regRowid);
      sqlite3VdbeGoto(v, addrInsLoop);
      sqlite3VdbeJumpHere(v, addrInsLoop);
      sqlite3VdbeAddOp1(v, OP_Close, 1);
    }

    /* Compute the complete text of the CREATE statement */
    if( pSelect ){
      zStmt = createTableStmt(db, p);
    }else{
      Token *pEnd2 = tabOpts ? &pParse->sLastToken : pEnd;
      n = (int)(pEnd2->z - pParse->sNameToken.z);
      if( pEnd2->z[0]!=';' ) n += pEnd2->n;
      zStmt = sqlite3MPrintf(db, 
          "CREATE %s %.*s", zType2, n, pParse->sNameToken.z
      );
    }

    /* A slot for the record has already been allocated in the 
    ** SQLITE_MASTER table.  We just need to update that slot with all
    ** the information we've collected.
    */
    sqlite3NestedParse(pParse,
      "UPDATE %Q.%s "
         "SET type='%s', name=%Q, tbl_name=%Q, rootpage=#%d, sql=%Q "
       "WHERE rowid=#%d",
      db->aDb[iDb].zDbSName, MASTER_NAME,
      zType,
      p->zName,
      p->zName,
      pParse->regRoot,
      zStmt,
      pParse->regRowid
    );
    sqlite3DbFree(db, zStmt);
    sqlite3ChangeCookie(pParse, iDb);

#ifndef SQLITE_OMIT_AUTOINCREMENT
    /* Check to see if we need to create an sqlite_sequence table for
    ** keeping track of autoincrement keys.
    */
    if( (p->tabFlags & TF_Autoincrement)!=0 ){
      Db *pDb = &db->aDb[iDb];
      assert( sqlite3SchemaMutexHeld(db, iDb, 0) );
      if( pDb->pSchema->pSeqTab==0 ){
        sqlite3NestedParse(pParse,
          "CREATE TABLE %Q.sqlite_sequence(name,seq)",
          pDb->zDbSName
        );
      }
    }
#endif

    /* Reparse everything to update our internal data structures */
    sqlite3VdbeAddParseSchemaOp(v, iDb,
           sqlite3MPrintf(db, "tbl_name='%q' AND type!='trigger'", p->zName));
  }


  /* Add the table to the in-memory representation of the database.
  */
  if( db->init.busy ){
    Table *pOld;
    Schema *pSchema = p->pSchema;
    assert( sqlite3SchemaMutexHeld(db, iDb, 0) );
    pOld = sqlite3HashInsert(&pSchema->tblHash, p->zName, p);
    if( pOld ){
      assert( p==pOld );  /* Malloc must have failed inside HashInsert() */
      sqlite3OomFault(db);
      return;
    }
    pParse->pNewTable = 0;
    db->flags |= SQLITE_InternChanges;

#ifndef SQLITE_OMIT_ALTERTABLE
    if( !p->pSelect ){
      const char *zName = (const char *)pParse->sNameToken.z;
      int nName;
      assert( !pSelect && pCons && pEnd );
      if( pCons->z==0 ){
        pCons = pEnd;
      }
      nName = (int)((const char *)pCons->z - zName);
      p->addColOffset = 13 + sqlite3Utf8CharLen(zName, nName);
    }
#endif
  }
}